

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tsq.hpp
# Opt level: O0

Node * __thiscall tf::UnboundedTaskQueue<tf::Node_*>::steal(UnboundedTaskQueue<tf::Node_*> *this)

{
  long lVar1;
  long lVar2;
  long *in_RDI;
  Array *a;
  Node *item;
  int64_t b;
  int64_t t;
  memory_order __b_1;
  memory_order __b;
  int64_t in_stack_fffffffffffffe28;
  undefined4 in_stack_fffffffffffffe30;
  memory_order in_stack_fffffffffffffe34;
  atomic<tf::UnboundedTaskQueue<tf::Node_*>::Array_*> *in_stack_fffffffffffffe38;
  Node *local_88;
  
  std::operator&(memory_order_acquire,__memory_order_mask);
  lVar2 = *in_RDI;
  std::operator&(memory_order_acquire,__memory_order_mask);
  local_88 = (Node *)0x0;
  if (lVar2 < in_RDI[0x10]) {
    std::atomic<tf::UnboundedTaskQueue<tf::Node_*>::Array_*>::load
              (in_stack_fffffffffffffe38,in_stack_fffffffffffffe34);
    local_88 = Array::pop((Array *)CONCAT44(in_stack_fffffffffffffe34,in_stack_fffffffffffffe30),
                          in_stack_fffffffffffffe28);
    LOCK();
    lVar1 = *in_RDI;
    if (lVar2 == lVar1) {
      *in_RDI = lVar2 + 1;
    }
    UNLOCK();
    if (lVar2 != lVar1) {
      return (Node *)0x0;
    }
  }
  return local_88;
}

Assistant:

T UnboundedTaskQueue<T>::steal() {
  
  int64_t t = _top.load(std::memory_order_acquire);
  std::atomic_thread_fence(std::memory_order_seq_cst);
  int64_t b = _bottom.load(std::memory_order_acquire);

  T item {nullptr};

  if(t < b) {
    Array* a = _array.load(std::memory_order_consume);
    item = a->pop(t);
    if(!_top.compare_exchange_strong(t, t+1,
                                     std::memory_order_seq_cst,
                                     std::memory_order_relaxed)) {
      return nullptr;
    }
  }

  return item;
}